

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

LSTMWeightParams * __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_weightparams
          (UniDirectionalLSTMLayerParams *this)

{
  LSTMWeightParams *this_00;
  
  this_00 = this->weightparams_;
  if (this_00 == (LSTMWeightParams *)0x0) {
    this_00 = (LSTMWeightParams *)operator_new(0x90);
    LSTMWeightParams::LSTMWeightParams(this_00);
    this->weightparams_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::LSTMWeightParams* UniDirectionalLSTMLayerParams::mutable_weightparams() {
  
  if (weightparams_ == NULL) {
    weightparams_ = new ::CoreML::Specification::LSTMWeightParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.UniDirectionalLSTMLayerParams.weightParams)
  return weightparams_;
}